

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void TCLAP::ClearContainer<std::__cxx11::list<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
               (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *c)

{
  iterator __first;
  iterator __last;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *c_local;
  
  __first = std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(c);
  __last = std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(c);
  __std__for_each<std::_List_iterator<TCLAP::Arg*>,void(*)(TCLAP::Arg*)>_std___List_iterator<TCLAP::Arg*>_std___List_iterator<TCLAP::Arg*>_void____TCLAP__Arg____
            ((_List_iterator<TCLAP::Arg_*>)__first._M_node,
             (_List_iterator<TCLAP::Arg_*>)__last._M_node,DelPtr<TCLAP::Arg*>);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::clear(c);
  return;
}

Assistant:

void ClearContainer(C &c)
{
	typedef typename C::value_type value_type;
	std::for_each(c.begin(), c.end(), DelPtr<value_type>);
	c.clear();
}